

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.h
# Opt level: O3

void __thiscall cmFindBase::~cmFindBase(cmFindBase *this)

{
  ~cmFindBase(this);
  operator_delete(this,600);
  return;
}

Assistant:

virtual ~cmFindBase() = default;